

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O2

int quicly_receive(quicly_conn_t *conn,sockaddr *dest_addr,sockaddr *src_addr,
                  quicly_decoded_packet_t *packet)

{
  anon_struct_16_2_d6821df0_for_num_bytes *paVar1;
  uint64_t *puVar2;
  anon_struct_464_5_de580c36_for_stats *paVar3;
  anon_struct_4_2_d91fd178_for_address_validation *paVar4;
  st_quicly_cid_t *cid;
  quicly_state_t qVar5;
  ulong uVar6;
  long lVar7;
  byte *pbVar8;
  _func_void_void_ptr_char_ptr_varargs *p_Var9;
  size_t sVar10;
  size_t sVar11;
  size_t sVar12;
  undefined8 uVar13;
  uint64_t arg1;
  uint8_t arg5;
  int iVar14;
  uint32_t uVar15;
  int iVar16;
  ptls_aead_context_t *retry_aead;
  uint8_t *puVar17;
  anon_struct_216_2_55ab8ea6_for_cipher *paVar18;
  st_quicly_application_space_t *psVar19;
  quicly_conn_t *aead_ctx;
  uint32_t uVar20;
  code *aead_cb;
  st_quicly_application_space_t **ppsVar21;
  ptls_cipher_context_t *header_protection;
  size_t sStackY_80;
  size_t local_70;
  int is_ack_only;
  uint64_t local_60;
  uint64_t offending_frame_type;
  uint64_t pn;
  ptls_iovec_t payload;
  
  offending_frame_type = 0;
  if ((src_addr->sa_family | 8) != 10) {
    __assert_fail("src_addr->sa_family == AF_INET || src_addr->sa_family == AF_INET6",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                  ,0x1604,
                  "int quicly_receive(quicly_conn_t *, struct sockaddr *, struct sockaddr *, quicly_decoded_packet_t *)"
                 );
  }
  lock_now(conn,0);
  iVar14 = is_stateless_reset(conn,packet);
  if (iVar14 == 0) {
    uVar6 = packet->datagram_size;
    paVar1 = &(conn->super).stats.num_bytes;
    paVar1->received = paVar1->received + uVar6;
    qVar5 = (conn->super).state;
    if (qVar5 != QUICLY_STATE_DRAINING) {
      if (qVar5 == QUICLY_STATE_CLOSING) {
        uVar6 = (conn->egress).connection_close.num_packets_received;
        (conn->egress).connection_close.num_packets_received = uVar6 + 1;
        if (uVar6 < (uVar6 + 1 ^ uVar6)) {
          (conn->egress).send_ack_at = 0;
        }
        goto LAB_0011ace9;
      }
      pbVar8 = (packet->octets).base;
      if ((char)*pbVar8 < '\0') {
        uVar20 = packet->version;
        if (qVar5 == QUICLY_STATE_FIRSTFLIGHT && uVar20 == 0) {
          sVar10 = packet->encrypted_off;
          payload.base = pbVar8 + sVar10;
          sVar11 = (packet->octets).len;
          iVar14 = 0x2000a;
          if ((sVar11 == sVar10) || (((int)sVar11 - (int)sVar10 & 3U) != 0)) goto LAB_0011ac71;
          uVar20 = 0;
          while (payload.base != pbVar8 + sVar11) {
            uVar15 = quicly_decode32(&payload.base);
            if (uVar15 == 0xff00001b) {
              if (uVar20 == 0) {
                uVar20 = 0xff00001b;
              }
            }
            else if (uVar15 == 0xff00001d) {
              uVar20 = 0xff00001d;
            }
          }
          if (uVar20 == 0) {
            iVar14 = 0xff05;
            goto LAB_0011ac67;
          }
          (conn->super).version = uVar20;
          iVar14 = reinstall_initial_encryption(conn,0x203);
joined_r0x0011b1bd:
          if (iVar14 == 0) {
            iVar14 = discard_sentmap_by_epoch(conn,0xffffffff);
          }
          goto LAB_0011ac71;
        }
        iVar14 = 0xff01;
        if (uVar20 != (conn->super).version) goto switchD_0011ae77_default;
        switch(*pbVar8 - 0xc0 >> 4) {
        case 0:
          psVar19 = (st_quicly_application_space_t *)conn->initial;
          if ((psVar19 == (st_quicly_application_space_t *)0x0) ||
             (header_protection = (psVar19->cipher).ingress.header_protection.one_rtt,
             header_protection == (ptls_cipher_context_t *)0x0)) goto switchD_0011ae77_default;
          if (((conn->super).local.bidi.next_stream_id & 1) == 0) {
            if (qVar5 == QUICLY_STATE_FIRSTFLIGHT) {
              sVar12 = (packet->cid).src.len;
              memcpy(&(conn->super).remote.cid_set.cids[0].cid,(packet->cid).src.base,sVar12);
              (conn->super).remote.cid_set.cids[0].cid.len = (uint8_t)sVar12;
              psVar19 = (st_quicly_application_space_t *)conn->initial;
            }
          }
          else if (uVar6 < 0x4b0) goto switchD_0011ae77_default;
          ppsVar21 = (st_quicly_application_space_t **)&conn->initial;
          paVar18 = &psVar19->cipher;
          local_70 = 0;
          goto LAB_0011b2c6;
        case 1:
          if (((((conn->super).local.bidi.next_stream_id & 1) == 0) ||
              (psVar19 = conn->application, psVar19 == (st_quicly_application_space_t *)0x0)) ||
             (header_protection = (psVar19->cipher).ingress.header_protection.zero_rtt,
             header_protection == (ptls_cipher_context_t *)0x0)) goto switchD_0011ae77_default;
          ppsVar21 = &conn->application;
          paVar18 = (anon_struct_216_2_55ab8ea6_for_cipher *)((psVar19->cipher).ingress.aead + 1);
          sStackY_80 = 1;
          break;
        case 2:
          psVar19 = (st_quicly_application_space_t *)conn->handshake;
          if ((psVar19 == (st_quicly_application_space_t *)0x0) ||
             (header_protection = (psVar19->cipher).ingress.header_protection.one_rtt,
             header_protection == (ptls_cipher_context_t *)0x0)) goto switchD_0011ae77_default;
          ppsVar21 = (st_quicly_application_space_t **)&conn->handshake;
          paVar18 = &psVar19->cipher;
          sStackY_80 = 2;
          break;
        case 3:
          if (packet->encrypted_off + 0x10 != (packet->octets).len) {
            __assert_fail("packet->encrypted_off + PTLS_AESGCM_TAG_SIZE == packet->octets.len",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                          ,0x1632,
                          "int quicly_receive(quicly_conn_t *, struct sockaddr *, struct sockaddr *, quicly_decoded_packet_t *)"
                         );
          }
          if (((conn->super).local.bidi.next_stream_id & 1) != 0) goto switchD_0011ae77_default;
          cid = &(conn->super).remote.cid_set.cids[0].cid;
          iVar16 = quicly_cid_is_equal(cid,(packet->cid).src);
          if ((iVar16 != 0) || ((conn->retry_scid).len != 0xff)) goto switchD_0011ae77_default;
          retry_aead = create_retry_aead((conn->super).ctx,uVar20,0);
          iVar16 = validate_retry_tag(packet,cid,retry_aead);
          ptls_aead_free(retry_aead);
          if ((iVar16 == 0) || (0x200 < (packet->token).len)) goto switchD_0011ae77_default;
          free((conn->token).base);
          sVar12 = (packet->token).len;
          puVar17 = (uint8_t *)malloc(sVar12);
          (conn->token).base = puVar17;
          if (puVar17 == (uint8_t *)0x0) {
            iVar14 = 0x201;
            goto switchD_0011ae77_default;
          }
          memcpy(puVar17,(packet->token).base,sVar12);
          (conn->token).len = sVar12;
          sVar12 = (packet->cid).src.len;
          memcpy(cid,(packet->cid).src.base,sVar12);
          (conn->super).remote.cid_set.cids[0].cid.len = (uint8_t)sVar12;
          uVar13 = *(undefined8 *)((conn->super).remote.cid_set.cids[0].cid.cid + 8);
          *(undefined8 *)(conn->retry_scid).cid = *(undefined8 *)cid->cid;
          *(undefined8 *)((conn->retry_scid).cid + 8) = uVar13;
          *(undefined8 *)((conn->retry_scid).cid + 0xd) =
               *(undefined8 *)((conn->super).remote.cid_set.cids[0].cid.cid + 0xd);
          iVar14 = reinstall_initial_encryption(conn,0xff01);
          goto joined_r0x0011b1bd;
        default:
          goto switchD_0011ae77_default;
        }
        local_70 = sStackY_80;
LAB_0011b2c6:
        aead_ctx = (quicly_conn_t *)(paVar18->ingress).header_protection.zero_rtt;
        aead_cb = aead_decrypt_fixed_key;
      }
      else {
        psVar19 = conn->application;
        iVar14 = 0xff01;
        if ((psVar19 == (st_quicly_application_space_t *)0x0) ||
           (header_protection = (psVar19->cipher).ingress.header_protection.one_rtt,
           header_protection == (ptls_cipher_context_t *)0x0)) goto switchD_0011ae77_default;
        ppsVar21 = &conn->application;
        local_70 = 3;
        aead_cb = aead_decrypt_1rtt;
        aead_ctx = conn;
      }
      iVar14 = decrypt_packet(header_protection,aead_cb,aead_ctx,
                              &(psVar19->super).next_expected_packet_number,packet,&pn,&payload);
      puVar17 = payload.base;
      if (iVar14 == 0) {
        local_60 = (conn->stash).now;
        arg5 = get_epoch(*(packet->octets).base);
        arg1 = local_60;
        local_60 = pn;
        QUICLY_TRACER_PACKET_RECEIVED(conn,arg1,pn,puVar17,payload.len,arg5);
        if ((conn->super).state == QUICLY_STATE_FIRSTFLIGHT) {
          (conn->super).state = QUICLY_STATE_CONNECTED;
        }
        paVar3 = &(conn->super).stats;
        (paVar3->num_packets).received = (paVar3->num_packets).received + 1;
        if ((int)local_70 == 2) {
          if (conn->initial != (st_quicly_handshake_space_t *)0x0) {
            iVar14 = discard_handshake_context(conn,0);
            if (iVar14 != 0) goto LAB_0011ac71;
            update_loss_alarm(conn,0);
            paVar4 = &(conn->super).remote.address_validation;
            *(byte *)paVar4 = *(byte *)paVar4 | 1;
          }
        }
        else if (local_70 == 0) {
          if ((ulong)conn->initial->largest_ingress_udp_payload_size < packet->datagram_size) {
            conn->initial->largest_ingress_udp_payload_size = (uint16_t)packet->datagram_size;
          }
        }
        iVar14 = handle_payload(conn,local_70,puVar17,payload.len,&offending_frame_type,&is_ack_only
                               );
        if ((iVar14 == 0) &&
           (((*ppsVar21 == (st_quicly_application_space_t *)0x0 ||
             (QUICLY_STATE_CONNECTED < (conn->super).state)) ||
            (iVar14 = record_receipt(&(*ppsVar21)->super,local_60,is_ack_only,(conn->stash).now,
                                     &(conn->egress).send_ack_at), iVar14 == 0)))) {
          iVar14 = (*(code *)(&DAT_00125a04 + *(int *)(&DAT_00125a04 + local_70 * 4)))();
          return iVar14;
        }
      }
      else {
        puVar2 = &(conn->super).stats.num_packets.decryption_failed;
        *puVar2 = *puVar2 + 1;
        p_Var9 = (conn->super).tracer.cb;
        if (p_Var9 != (_func_void_void_ptr_char_ptr_varargs *)0x0) {
          (*p_Var9)((conn->super).tracer.ctx,
                    "{\"type\":\"packet-decryption-failed\", \"time\":%lld, \"pn\":%llu}\n",
                    (conn->stash).now,pn);
        }
      }
      goto LAB_0011ac71;
    }
  }
  else {
    iVar14 = 0xff04;
LAB_0011ac67:
    iVar14 = handle_close(conn,iVar14,0xffffffffffffffff,(ptls_iovec_t)ZEXT816(0x125411));
LAB_0011ac71:
    if (((iVar14 == 0xff07) || (iVar14 == 0x201)) || (iVar14 == 0xff01))
    goto switchD_0011ae77_default;
    if (iVar14 != 0) {
      initiate_close(conn,iVar14,offending_frame_type,"");
      iVar14 = 0;
      goto switchD_0011ae77_default;
    }
  }
LAB_0011ace9:
  lVar7 = (conn->stash).now;
  if ((conn->egress).loss.alarm_at < lVar7) {
    (conn->egress).loss.alarm_at = lVar7;
  }
  iVar14 = 0;
  assert_consistency(conn,0);
switchD_0011ae77_default:
  unlock_now(conn);
  return iVar14;
}

Assistant:

int quicly_receive(quicly_conn_t *conn, struct sockaddr *dest_addr, struct sockaddr *src_addr, quicly_decoded_packet_t *packet)
{
    ptls_cipher_context_t *header_protection;
    struct {
        int (*cb)(void *, uint64_t, quicly_decoded_packet_t *, size_t, size_t *);
        void *ctx;
    } aead;
    struct st_quicly_pn_space_t **space;
    size_t epoch;
    ptls_iovec_t payload;
    uint64_t pn, offending_frame_type = QUICLY_FRAME_TYPE_PADDING;
    int is_ack_only, ret;

    assert(src_addr->sa_family == AF_INET || src_addr->sa_family == AF_INET6);

    lock_now(conn, 0);

    QUICLY_PROBE(RECEIVE, conn, conn->stash.now,
                 QUICLY_PROBE_HEXDUMP(packet->cid.dest.encrypted.base, packet->cid.dest.encrypted.len), packet->octets.base,
                 packet->octets.len);

    if (is_stateless_reset(conn, packet)) {
        ret = handle_stateless_reset(conn);
        goto Exit;
    }

    /* FIXME check peer address */

    /* add unconditionally, as packet->datagram_size is set only for the first packet within the UDP datagram */
    conn->super.stats.num_bytes.received += packet->datagram_size;

    switch (conn->super.state) {
    case QUICLY_STATE_CLOSING:
        ++conn->egress.connection_close.num_packets_received;
        /* respond with a CONNECTION_CLOSE frame using exponential back-off */
        if (__builtin_popcountl(conn->egress.connection_close.num_packets_received) == 1)
            conn->egress.send_ack_at = 0;
        ret = 0;
        goto Exit;
    case QUICLY_STATE_DRAINING:
        ret = 0;
        goto Exit;
    default:
        break;
    }

    if (QUICLY_PACKET_IS_LONG_HEADER(packet->octets.base[0])) {
        if (conn->super.state == QUICLY_STATE_FIRSTFLIGHT) {
            if (packet->version == 0) {
                ret = handle_version_negotiation_packet(conn, packet);
                goto Exit;
            }
        }
        if (packet->version != conn->super.version) {
            ret = QUICLY_ERROR_PACKET_IGNORED;
            goto Exit;
        }
        switch (packet->octets.base[0] & QUICLY_PACKET_TYPE_BITMASK) {
        case QUICLY_PACKET_TYPE_RETRY: {
            assert(packet->encrypted_off + PTLS_AESGCM_TAG_SIZE == packet->octets.len);
            /* handle only if the connection is the client */
            if (!quicly_is_client(conn)) {
                ret = QUICLY_ERROR_PACKET_IGNORED;
                goto Exit;
            }
            /* server CID has to change */
            if (quicly_cid_is_equal(&conn->super.remote.cid_set.cids[0].cid, packet->cid.src)) {
                ret = QUICLY_ERROR_PACKET_IGNORED;
                goto Exit;
            }
            /* do not accept a second Retry */
            if (is_retry(conn)) {
                ret = QUICLY_ERROR_PACKET_IGNORED;
                goto Exit;
            }
            ptls_aead_context_t *retry_aead = create_retry_aead(conn->super.ctx, conn->super.version, 0);
            int retry_ok = validate_retry_tag(packet, &conn->super.remote.cid_set.cids[0].cid, retry_aead);
            ptls_aead_free(retry_aead);
            if (!retry_ok) {
                ret = QUICLY_ERROR_PACKET_IGNORED;
                goto Exit;
            }
            /* check size of the Retry packet */
            if (packet->token.len > QUICLY_MAX_TOKEN_LEN) {
                ret = QUICLY_ERROR_PACKET_IGNORED; /* TODO this is a immediate fatal error, chose a better error code */
                goto Exit;
            }
            /* store token and ODCID */
            free(conn->token.base);
            if ((conn->token.base = malloc(packet->token.len)) == NULL) {
                ret = PTLS_ERROR_NO_MEMORY;
                goto Exit;
            }
            memcpy(conn->token.base, packet->token.base, packet->token.len);
            conn->token.len = packet->token.len;
            /* update DCID */
            quicly_set_cid(&conn->super.remote.cid_set.cids[0].cid, packet->cid.src);
            conn->retry_scid = conn->super.remote.cid_set.cids[0].cid;
            /* replace initial keys, or drop the keys if this is a response packet to a greased version */
            if ((ret = reinstall_initial_encryption(conn, QUICLY_ERROR_PACKET_IGNORED)) != 0)
                goto Exit;
            /* schedule retransmit */
            ret = discard_sentmap_by_epoch(conn, ~0u);
            goto Exit;
        } break;
        case QUICLY_PACKET_TYPE_INITIAL:
            if (conn->initial == NULL || (header_protection = conn->initial->cipher.ingress.header_protection) == NULL) {
                ret = QUICLY_ERROR_PACKET_IGNORED;
                goto Exit;
            }
            if (quicly_is_client(conn)) {
                /* client: update cid if this is the first Initial packet that's being received */
                if (conn->super.state == QUICLY_STATE_FIRSTFLIGHT)
                    quicly_set_cid(&conn->super.remote.cid_set.cids[0].cid, packet->cid.src);
            } else {
                /* server: ignore packets that are too small */
                if (packet->datagram_size < QUICLY_MIN_CLIENT_INITIAL_SIZE) {
                    ret = QUICLY_ERROR_PACKET_IGNORED;
                    goto Exit;
                }
            }
            aead.cb = aead_decrypt_fixed_key;
            aead.ctx = conn->initial->cipher.ingress.aead;
            space = (void *)&conn->initial;
            epoch = QUICLY_EPOCH_INITIAL;
            break;
        case QUICLY_PACKET_TYPE_HANDSHAKE:
            if (conn->handshake == NULL || (header_protection = conn->handshake->cipher.ingress.header_protection) == NULL) {
                ret = QUICLY_ERROR_PACKET_IGNORED;
                goto Exit;
            }
            aead.cb = aead_decrypt_fixed_key;
            aead.ctx = conn->handshake->cipher.ingress.aead;
            space = (void *)&conn->handshake;
            epoch = QUICLY_EPOCH_HANDSHAKE;
            break;
        case QUICLY_PACKET_TYPE_0RTT:
            if (quicly_is_client(conn)) {
                ret = QUICLY_ERROR_PACKET_IGNORED;
                goto Exit;
            }
            if (conn->application == NULL ||
                (header_protection = conn->application->cipher.ingress.header_protection.zero_rtt) == NULL) {
                ret = QUICLY_ERROR_PACKET_IGNORED;
                goto Exit;
            }
            aead.cb = aead_decrypt_fixed_key;
            aead.ctx = conn->application->cipher.ingress.aead[1];
            space = (void *)&conn->application;
            epoch = QUICLY_EPOCH_0RTT;
            break;
        default:
            ret = QUICLY_ERROR_PACKET_IGNORED;
            goto Exit;
        }
    } else {
        /* short header packet */
        if (conn->application == NULL ||
            (header_protection = conn->application->cipher.ingress.header_protection.one_rtt) == NULL) {
            ret = QUICLY_ERROR_PACKET_IGNORED;
            goto Exit;
        }
        aead.cb = aead_decrypt_1rtt;
        aead.ctx = conn;
        space = (void *)&conn->application;
        epoch = QUICLY_EPOCH_1RTT;
    }

    /* decrypt */
    if ((ret = decrypt_packet(header_protection, aead.cb, aead.ctx, &(*space)->next_expected_packet_number, packet, &pn,
                              &payload)) != 0) {
        ++conn->super.stats.num_packets.decryption_failed;
        QUICLY_PROBE(PACKET_DECRYPTION_FAILED, conn, conn->stash.now, pn);
        goto Exit;
    }

    QUICLY_PROBE(PACKET_RECEIVED, conn, conn->stash.now, pn, payload.base, payload.len, get_epoch(packet->octets.base[0]));

    /* update states */
    if (conn->super.state == QUICLY_STATE_FIRSTFLIGHT)
        conn->super.state = QUICLY_STATE_CONNECTED;
    conn->super.stats.num_packets.received += 1;

    /* state updates, that are triggered by the receipt of a packet */
    switch (epoch) {
    case QUICLY_EPOCH_INITIAL:
        /* update max_ingress_udp_payload_size if necessary */
        if (conn->initial->largest_ingress_udp_payload_size < packet->datagram_size)
            conn->initial->largest_ingress_udp_payload_size = packet->datagram_size;
        break;
    case QUICLY_EPOCH_HANDSHAKE:
        /* Discard Initial space before processing the payload of the Handshake packet to avoid the chance of an ACK frame included
         * in the Handshake packet setting a loss timer for the Initial packet. */
        if (conn->initial != NULL) {
            if ((ret = discard_handshake_context(conn, QUICLY_EPOCH_INITIAL)) != 0)
                goto Exit;
            update_loss_alarm(conn, 0);
            conn->super.remote.address_validation.validated = 1;
        }
        break;
    default:
        break;
    }

    /* handle the payload */
    if ((ret = handle_payload(conn, epoch, payload.base, payload.len, &offending_frame_type, &is_ack_only)) != 0)
        goto Exit;
    if (*space != NULL && conn->super.state < QUICLY_STATE_CLOSING) {
        if ((ret = record_receipt(*space, pn, is_ack_only, conn->stash.now, &conn->egress.send_ack_at)) != 0)
            goto Exit;
    }

    /* state updates post payload processing */
    switch (epoch) {
    case QUICLY_EPOCH_INITIAL:
        assert(conn->initial != NULL);
        if (quicly_is_client(conn) && conn->handshake != NULL && conn->handshake->cipher.egress.aead != NULL) {
            if ((ret = discard_handshake_context(conn, QUICLY_EPOCH_INITIAL)) != 0)
                goto Exit;
            update_loss_alarm(conn, 0);
        }
        break;
    case QUICLY_EPOCH_HANDSHAKE:
        if (quicly_is_client(conn)) {
            /* Running as a client.
             * Respect "disable_migration" TP sent by the remote peer at the end of the TLS handshake. */
            if (conn->super.local.address.sa.sa_family == AF_UNSPEC && dest_addr != NULL && dest_addr->sa_family != AF_UNSPEC &&
                ptls_handshake_is_complete(conn->crypto.tls) && conn->super.remote.transport_params.disable_active_migration)
                set_address(&conn->super.local.address, dest_addr);
        } else {
            /* Running as a server.
             * If handshake was just completed, drop handshake context, schedule the first emission of HANDSHAKE_DONE frame. */
            if (ptls_handshake_is_complete(conn->crypto.tls)) {
                if ((ret = discard_handshake_context(conn, QUICLY_EPOCH_HANDSHAKE)) != 0)
                    goto Exit;
                assert(conn->handshake == NULL);
                conn->egress.pending_flows |= QUICLY_PENDING_FLOW_HANDSHAKE_DONE_BIT;
                update_loss_alarm(conn, 0);
            }
        }
        break;
    case QUICLY_EPOCH_1RTT:
        if (!is_ack_only && should_send_max_data(conn))
            conn->egress.send_ack_at = 0;
        break;
    default:
        break;
    }

    update_idle_timeout(conn, 1);

Exit:
    switch (ret) {
    case 0:
        /* Avoid time in the past being emitted by quicly_get_first_timeout. We hit the condition below when retransmission is
         * suspended by the 3x limit (in which case we have loss.alarm_at set but return INT64_MAX from quicly_get_first_timeout
         * until we receive something from the client).
         */
        if (conn->egress.loss.alarm_at < conn->stash.now)
            conn->egress.loss.alarm_at = conn->stash.now;
        assert_consistency(conn, 0);
        break;
    case PTLS_ERROR_NO_MEMORY:
    case QUICLY_ERROR_STATE_EXHAUSTION:
    case QUICLY_ERROR_PACKET_IGNORED:
        break;
    default: /* close connection */
        initiate_close(conn, ret, offending_frame_type, "");
        ret = 0;
        break;
    }
    unlock_now(conn);
    return ret;
}